

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::GLMClassifier::clear_ClassLabels(GLMClassifier *this)

{
  ClassLabelsCase CVar1;
  GLMClassifier *this_local;
  
  CVar1 = ClassLabels_case(this);
  if (CVar1 != CLASSLABELS_NOT_SET) {
    if (CVar1 == kStringClassLabels) {
      if ((this->ClassLabels_).stringclasslabels_ != (StringVector *)0x0) {
        (*(((this->ClassLabels_).stringclasslabels_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if ((CVar1 == kInt64ClassLabels) &&
            ((this->ClassLabels_).stringclasslabels_ != (StringVector *)0x0)) {
      (*(((this->ClassLabels_).stringclasslabels_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void GLMClassifier::clear_ClassLabels() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.GLMClassifier)
  switch (ClassLabels_case()) {
    case kStringClassLabels: {
      delete ClassLabels_.stringclasslabels_;
      break;
    }
    case kInt64ClassLabels: {
      delete ClassLabels_.int64classlabels_;
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = CLASSLABELS_NOT_SET;
}